

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O2

int fe_process_frames_int16
              (fe_t *fe,int16 **inout_spch,size_t *inout_nsamps,mfcc_t **buf_cep,
              int32 *inout_nframes)

{
  short sVar1;
  size_t sVar2;
  int16 *in;
  int iVar3;
  int iVar4;
  long lVar5;
  int16 *piVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  
  sVar2 = *inout_nsamps;
  iVar8 = fe->num_overflow_samps;
  lVar9 = (long)iVar8;
  uVar12 = sVar2 + lVar9;
  sVar1 = fe->frame_size;
  uVar10 = (ulong)sVar1;
  if (buf_cep == (mfcc_t **)0x0) {
    if (uVar10 <= uVar12) {
      uVar11 = (int)((uVar12 - uVar10) / (ulong)(long)fe->frame_shift) + 1;
      uVar12 = (ulong)uVar11;
      goto LAB_00123473;
    }
LAB_001232e3:
    uVar12 = 0;
  }
  else if (uVar12 < uVar10) {
    uVar12 = 0;
    if (sVar2 != 0) {
      memcpy(fe->overflow_samps + lVar9,*inout_spch,sVar2 * 2);
      sVar2 = *inout_nsamps;
      fe->num_overflow_samps = fe->num_overflow_samps + (int)sVar2;
      *inout_spch = *inout_spch + sVar2;
      *inout_nsamps = 0;
    }
  }
  else {
    iVar4 = *inout_nframes;
    if (iVar4 < 1) goto LAB_001232e3;
    in = *inout_spch;
    uVar11 = (uint)((uVar12 - uVar10) / (ulong)(long)fe->frame_shift);
    if ((int)(uVar11 + 1) < iVar4) {
      iVar4 = uVar11 + 1;
    }
    if (iVar8 == 0) {
      fe_read_frame_int16(fe,in,(int)sVar1);
      if (0x7ffffffe < uVar11) {
        __assert_fail("outidx < frame_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                      ,0x1ab,
                      "int fe_process_frames_int16(fe_t *, const int16 **, size_t *, mfcc_t **, int32 *)"
                     );
      }
      fe_write_frame(fe,*buf_cep);
      sVar1 = fe->frame_size;
      piVar6 = *inout_spch + sVar1;
      *inout_spch = piVar6;
      uVar10 = *inout_nsamps - (long)sVar1;
      *inout_nsamps = uVar10;
    }
    else {
      lVar5 = (long)(sVar1 - iVar8);
      memcpy(fe->overflow_samps + lVar9,in,lVar5 * 2);
      fe_read_frame_int16(fe,fe->overflow_samps,(int)fe->frame_size);
      if (0x7ffffffe < uVar11) {
        __assert_fail("outidx < frame_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                      ,0x1a1,
                      "int fe_process_frames_int16(fe_t *, const int16 **, size_t *, mfcc_t **, int32 *)"
                     );
      }
      fe_write_frame(fe,*buf_cep);
      piVar6 = *inout_spch + lVar5;
      *inout_spch = piVar6;
      uVar10 = *inout_nsamps - lVar5;
      *inout_nsamps = uVar10;
      fe->num_overflow_samps = fe->num_overflow_samps - (int)fe->frame_shift;
    }
    for (uVar12 = 1; (int)uVar12 < iVar4; uVar12 = uVar12 + 1) {
      if (uVar10 < (ulong)(long)fe->frame_shift) {
        __assert_fail("*inout_nsamps >= (size_t)fe->frame_shift",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                      ,0x1b5,
                      "int fe_process_frames_int16(fe_t *, const int16 **, size_t *, mfcc_t **, int32 *)"
                     );
      }
      fe_shift_frame_int16(fe,piVar6,(int)fe->frame_shift);
      fe_write_frame(fe,buf_cep[uVar12]);
      sVar1 = fe->frame_shift;
      piVar6 = *inout_spch + sVar1;
      *inout_spch = piVar6;
      uVar10 = *inout_nsamps - (long)sVar1;
      *inout_nsamps = uVar10;
      if (0 < fe->num_overflow_samps) {
        fe->num_overflow_samps = fe->num_overflow_samps - (int)sVar1;
      }
    }
    lVar5 = (long)fe->num_overflow_samps;
    if (lVar5 < 1) {
      iVar4 = (int)fe->frame_shift;
      iVar8 = (int)uVar10;
      if (iVar4 <= (int)uVar10) {
        iVar8 = iVar4;
      }
      lVar5 = (long)fe->frame_size - (long)iVar4;
      lVar9 = (long)piVar6 - (long)in >> 1;
      iVar3 = (int)lVar9;
      if (lVar5 <= lVar9) {
        iVar3 = (int)lVar5;
      }
      iVar7 = iVar3 + iVar8;
      fe->num_overflow_samps = iVar7;
      if (iVar7 == 0 || SCARRY4(iVar3,iVar8) != iVar7 < 0) goto LAB_00123486;
      memcpy(fe->overflow_samps,piVar6 + ((long)iVar4 - (long)fe->frame_size),
             (ulong)(uint)(iVar7 * 2));
      piVar6 = *inout_spch;
    }
    else {
      memmove(fe->overflow_samps,fe->overflow_samps + (lVar9 - lVar5),lVar5 * 2);
      iVar4 = (int)((ulong)((long)*inout_spch - (long)in) >> 1) + (int)*inout_nsamps;
      iVar8 = (int)fe->frame_size - fe->num_overflow_samps;
      if (iVar4 <= iVar8) {
        iVar8 = iVar4;
      }
      memcpy(fe->overflow_samps + fe->num_overflow_samps,in,(long)iVar8 * 2);
      fe->num_overflow_samps = fe->num_overflow_samps + iVar8;
      piVar6 = *inout_spch;
      lVar9 = (long)piVar6 - (long)in >> 1;
      if (iVar8 <= lVar9) {
LAB_00123486:
        uVar11 = 0;
        goto LAB_00123473;
      }
      iVar8 = iVar8 - (int)lVar9;
    }
    *inout_spch = piVar6 + iVar8;
    *inout_nsamps = *inout_nsamps - (long)iVar8;
  }
  uVar11 = 0;
LAB_00123473:
  *inout_nframes = (int32)uVar12;
  return uVar11;
}

Assistant:

int
fe_process_frames_int16(fe_t *fe,
                  int16 const **inout_spch,
                  size_t *inout_nsamps,
                  mfcc_t **buf_cep,
                  int32 *inout_nframes)
{
    int32 frame_count;
    int outidx, i, n_overflow, orig_n_overflow;
    int16 const *orig_spch;

    /* In the special case where there is no output buffer, return the
     * maximum number of frames which would be generated. */
    if (buf_cep == NULL) {
        if (*inout_nsamps + fe->num_overflow_samps < (size_t)fe->frame_size)
            *inout_nframes = 0;
        else
            *inout_nframes = 1
                + ((*inout_nsamps + fe->num_overflow_samps - fe->frame_size)
                   / fe->frame_shift);
        return *inout_nframes;
    }

    /* Are there not enough samples to make at least 1 frame? */
    if (*inout_nsamps + fe->num_overflow_samps < (size_t)fe->frame_size) {
        if (*inout_nsamps > 0) {
            /* Append them to the overflow buffer. */
            memcpy(fe->overflow_samps + fe->num_overflow_samps,
                   *inout_spch, *inout_nsamps * (sizeof(**inout_spch)));
            fe->num_overflow_samps += *inout_nsamps;
            /* Update input-output pointers and counters. */
            *inout_spch += *inout_nsamps;
            *inout_nsamps = 0;
        }
        /* We produced no frames of output, sorry! */
        *inout_nframes = 0;
        return 0;
    }

    /* Can't write a frame?  Then do nothing! */
    if (*inout_nframes < 1) {
        *inout_nframes = 0;
        return 0;
    }

    /* Keep track of the original start of the buffer. */
    orig_spch = *inout_spch;
    orig_n_overflow = fe->num_overflow_samps;
    /* How many frames will we be able to get? */
    frame_count = 1
        + ((*inout_nsamps + fe->num_overflow_samps - fe->frame_size)
           / fe->frame_shift);
    /* Limit it to the number of output frames available. */
    if (frame_count > *inout_nframes)
        frame_count = *inout_nframes;
    /* Index of output frame. */
    outidx = 0;

    /* Start processing, taking care of any incoming overflow. */
    if (fe->num_overflow_samps) {
        int offset = fe->frame_size - fe->num_overflow_samps;

        /* Append start of spch to overflow samples to make a full frame. */
        memcpy(fe->overflow_samps + fe->num_overflow_samps,
               *inout_spch, offset * sizeof(**inout_spch));
        fe_read_frame_int16(fe, fe->overflow_samps, fe->frame_size);
        assert(outidx < frame_count);
        fe_write_frame(fe, buf_cep[outidx]);
        outidx++;
        /* Update input-output pointers and counters. */
        *inout_spch += offset;
        *inout_nsamps -= offset;
        fe->num_overflow_samps -= fe->frame_shift;
    }
    else {
        fe_read_frame_int16(fe, *inout_spch, fe->frame_size);
        assert(outidx < frame_count);
        fe_write_frame(fe, buf_cep[outidx]);
        outidx++;
        /* Update input-output pointers and counters. */
        *inout_spch += fe->frame_size;
        *inout_nsamps -= fe->frame_size;
    }

    /* Process all remaining frames. */
    for (i = 1; i < frame_count; ++i) {
        assert(*inout_nsamps >= (size_t)fe->frame_shift);

        fe_shift_frame_int16(fe, *inout_spch, fe->frame_shift);
        assert(outidx < frame_count);
        fe_write_frame(fe, buf_cep[outidx]);
        outidx++;
        /* Update input-output pointers and counters. */
        *inout_spch += fe->frame_shift;
        *inout_nsamps -= fe->frame_shift;
        /* Amount of data behind the original input which is still needed. */
        if (fe->num_overflow_samps > 0)
            fe->num_overflow_samps -= fe->frame_shift;
    }

    /* How many relevant overflow samples are there left? */
    if (fe->num_overflow_samps <= 0) {
        /* Maximum number of overflow samples past *inout_spch to save. */
        n_overflow = *inout_nsamps;
        if (n_overflow > fe->frame_shift)
            n_overflow = fe->frame_shift;
        fe->num_overflow_samps = fe->frame_size - fe->frame_shift;
        /* Make sure this isn't an illegal read! */
        if (fe->num_overflow_samps > *inout_spch - orig_spch)
            fe->num_overflow_samps = *inout_spch - orig_spch;
        fe->num_overflow_samps += n_overflow;
        if (fe->num_overflow_samps > 0) {
            memcpy(fe->overflow_samps,
                   *inout_spch - (fe->frame_size - fe->frame_shift),
                   fe->num_overflow_samps * sizeof(**inout_spch));
            /* Update the input pointer to cover this stuff. */
            *inout_spch += n_overflow;
            *inout_nsamps -= n_overflow;
        }
    }
    else {
        /* There is still some relevant data left in the overflow buffer. */
        /* Shift existing data to the beginning. */
        memmove(fe->overflow_samps,
                fe->overflow_samps + orig_n_overflow - fe->num_overflow_samps,
                fe->num_overflow_samps * sizeof(*fe->overflow_samps));
        /* Copy in whatever we had in the original speech buffer. */
        n_overflow = *inout_spch - orig_spch + *inout_nsamps;
        if (n_overflow > fe->frame_size - fe->num_overflow_samps)
            n_overflow = fe->frame_size - fe->num_overflow_samps;
        memcpy(fe->overflow_samps + fe->num_overflow_samps,
               orig_spch, n_overflow * sizeof(*orig_spch));
        fe->num_overflow_samps += n_overflow;
        /* Advance the input pointers. */
        if (n_overflow > *inout_spch - orig_spch) {
            n_overflow -= (*inout_spch - orig_spch);
            *inout_spch += n_overflow;
            *inout_nsamps -= n_overflow;
        }
    }

    /* Finally update the frame counter with the number of frames we processed. */
    *inout_nframes = outidx; /* FIXME: Not sure why I wrote it this way... */
    return 0;
}